

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buf.c
# Opt level: O1

int xmlBufSetAllocationScheme(xmlBufPtr buf,xmlBufferAllocationScheme scheme)

{
  int iVar1;
  
  iVar1 = -1;
  if ((((buf != (xmlBufPtr)0x0) && (buf->error == 0)) &&
      ((buf->alloc & ~XML_BUFFER_ALLOC_EXACT) != XML_BUFFER_ALLOC_IMMUTABLE)) &&
     (scheme < (XML_BUFFER_ALLOC_HYBRID|XML_BUFFER_ALLOC_IMMUTABLE))) {
    if (scheme == XML_BUFFER_ALLOC_IO) {
      buf->alloc = XML_BUFFER_ALLOC_IO;
      buf->contentIO = buf->content;
      return iVar1;
    }
    buf->alloc = scheme;
    iVar1 = 0;
    if (buf->buffer != (xmlBufferPtr)0x0) {
      buf->buffer->alloc = scheme;
      return iVar1;
    }
  }
  return iVar1;
}

Assistant:

int
xmlBufSetAllocationScheme(xmlBufPtr buf,
                          xmlBufferAllocationScheme scheme) {
    if ((buf == NULL) || (buf->error != 0)) {
#ifdef DEBUG_BUFFER
        xmlGenericError(xmlGenericErrorContext,
		"xmlBufSetAllocationScheme: buf == NULL or in error\n");
#endif
        return(-1);
    }
    if ((buf->alloc == XML_BUFFER_ALLOC_IMMUTABLE) ||
        (buf->alloc == XML_BUFFER_ALLOC_IO))
        return(-1);
    if ((scheme == XML_BUFFER_ALLOC_DOUBLEIT) ||
        (scheme == XML_BUFFER_ALLOC_EXACT) ||
        (scheme == XML_BUFFER_ALLOC_HYBRID) ||
        (scheme == XML_BUFFER_ALLOC_IMMUTABLE) ||
	(scheme == XML_BUFFER_ALLOC_BOUNDED)) {
	buf->alloc = scheme;
        if (buf->buffer)
            buf->buffer->alloc = scheme;
        return(0);
    }
    /*
     * Switching a buffer ALLOC_IO has the side effect of initializing
     * the contentIO field with the current content
     */
    if (scheme == XML_BUFFER_ALLOC_IO) {
        buf->alloc = XML_BUFFER_ALLOC_IO;
        buf->contentIO = buf->content;
    }
    return(-1);
}